

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

void vkb::detail::setup_pNext_chain<VkDeviceCreateInfo>
               (VkDeviceCreateInfo *structure,
               vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_> *structs)

{
  value_type pVVar1;
  size_type sVar2;
  const_reference ppVVar3;
  ulong local_20;
  size_t i;
  vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_> *structs_local;
  VkDeviceCreateInfo *structure_local;
  
  structure->pNext = (void *)0x0;
  sVar2 = std::vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>::size(structs);
  if (sVar2 != 0) {
    for (local_20 = 0;
        sVar2 = std::vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>::size
                          (structs), local_20 < sVar2 - 1; local_20 = local_20 + 1) {
      ppVVar3 = std::vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>::at
                          (structs,local_20 + 1);
      pVVar1 = *ppVVar3;
      ppVVar3 = std::vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>::at
                          (structs,local_20);
      (*ppVVar3)->pNext = pVVar1;
    }
    ppVVar3 = std::vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>::at
                        (structs,0);
    structure->pNext = *ppVVar3;
  }
  return;
}

Assistant:

void setup_pNext_chain(T& structure, std::vector<VkBaseOutStructure*> const& structs) {
    structure.pNext = nullptr;
    if (structs.size() <= 0) return;
    for (size_t i = 0; i < structs.size() - 1; i++) {
        structs.at(i)->pNext = structs.at(i + 1);
    }
    structure.pNext = structs.at(0);
}